

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS FreeUnmarshalledDictionary
                    (JlMarshallElement *StructDescription,size_t StructDescriptionCount,
                    void *Structure)

{
  JlMarshallElement *Description;
  long *Structure_00;
  void *CountFieldPtr;
  size_t ListCount;
  char **stringPtr;
  size_t arrayCount;
  void *countFieldPtr;
  void *itemPtr;
  JL_DATA_TYPE type;
  JlMarshallElement *itemDescription;
  uint32_t i;
  JL_STATUS jlStatus;
  void *Structure_local;
  size_t StructDescriptionCount_local;
  JlMarshallElement *StructDescription_local;
  
  itemDescription._4_4_ = JL_STATUS_SUCCESS;
  for (itemDescription._0_4_ = 0;
      (uint)itemDescription < StructDescriptionCount && itemDescription._4_4_ == JL_STATUS_SUCCESS;
      itemDescription._0_4_ = (uint)itemDescription + 1) {
    Description = StructDescription + (uint)itemDescription;
    Structure_00 = (long *)((long)Structure + Description->FieldOffset);
    if ((Description->IsArray & 1U) == 0) {
      if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
        itemDescription._4_4_ =
             FreeUnmarshalledDictionary
                       (Description->ChildStructDescription,
                        (ulong)Description->ChildStructDescriptionCount,Structure_00);
      }
      else {
        if (((Description->Type == JL_DATA_TYPE_STRING) && (Description->FieldSize == 0)) &&
           (*Structure_00 != 0)) {
          WjTestLib_Free((void *)*Structure_00);
          *Structure_00 = 0;
        }
        itemDescription._4_4_ = JL_STATUS_SUCCESS;
      }
    }
    else {
      CountFieldPtr = (void *)((long)Structure + Description->CountFieldOffset);
      ListCount = JlMemoryReadCountValue(CountFieldPtr,Description->CountFieldSize);
      itemDescription._4_4_ = FreeUnmarshalledList(Description,Structure_00,ListCount);
      JlMemoryWriteCountValue(CountFieldPtr,Description->CountFieldSize,0);
    }
  }
  return itemDescription._4_4_;
}

Assistant:

static
JL_STATUS
    FreeUnmarshalledDictionary
    (
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        void*                       Structure
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* itemDescription = &StructDescription[i];
        JL_DATA_TYPE type = itemDescription->Type;
        void* itemPtr = ((uint8_t*)Structure)+itemDescription->FieldOffset;

        if( itemDescription->IsArray )
        {
            void* countFieldPtr = ((uint8_t*)Structure) + itemDescription->CountFieldOffset;
            size_t arrayCount = JlMemoryReadCountValue( countFieldPtr, itemDescription->CountFieldSize );
            jlStatus = FreeUnmarshalledList( itemDescription, itemPtr, arrayCount );
            (void) JlMemoryWriteCountValue( countFieldPtr, itemDescription->CountFieldSize, 0 );
        }
        else if( JL_DATA_TYPE_DICTIONARY == type )
        {
            jlStatus = FreeUnmarshalledDictionary( itemDescription->ChildStructDescription, itemDescription->ChildStructDescriptionCount, itemPtr );
        }
        else if( JL_DATA_TYPE_STRING == type )
        {
            if( 0 == itemDescription->FieldSize )
            {
                // 0 means that itemPtr is pointing to a char* that was allocated
                char** stringPtr = itemPtr;
                if( NULL != *stringPtr )
                {
                    JlFree( *stringPtr );
                    *stringPtr = NULL;
                }
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                // Fixed sized string in struct, so we don't deallocate it
                jlStatus = JL_STATUS_SUCCESS;
            }
        }
        else
        {
            // Is a Number, Bool. These are not allocated
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}